

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_pack.cpp
# Opt level: O0

int main(void)

{
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_const_char_*,_int>_> *ppcVar1;
  __tuple_element_t<1UL,_tuple<const_char_*,_const_char_*,_const_char_*,_int>_> *ppcVar2;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_const_char_*,_int>_> *ppcVar3;
  __tuple_element_t<3UL,_tuple<const_char_*,_const_char_*,_const_char_*,_int>_> *p_Var4;
  ostream *poVar5;
  type *d;
  type *c;
  type *b;
  type *a;
  _Head_base<2UL,_const_char_*,_false> local_48;
  _Head_base<1UL,_const_char_*,_false> local_40;
  _Head_base<0UL,_const_char_*,_false> local_38;
  int local_2c;
  type *local_28;
  tuple<const_char_*,_const_char_*,_const_char_*,_int> _tuple;
  
  local_2c = 99;
  std::make_tuple<char_const(&)[4],char_const(&)[4],char_const(&)[6],int>
            ((tuple<const_char_*,_const_char_*,_const_char_*,_int> *)&local_28,(char (*) [4])"Dog",
             (char (*) [4])"Cat",(char (*) [6])"Hyena",&local_2c);
  a = local_28;
  local_48._M_head_impl =
       (char *)_tuple.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_int>.
               super__Tuple_impl<1UL,_const_char_*,_const_char_*,_int>.
               super__Tuple_impl<2UL,_const_char_*,_int>._0_8_;
  local_40._M_head_impl =
       _tuple.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_int>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_int>.
       super__Tuple_impl<2UL,_const_char_*,_int>.super__Head_base<2UL,_const_char_*,_false>.
       _M_head_impl;
  local_38._M_head_impl =
       _tuple.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_int>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_int>.
       super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  ppcVar1 = std::get<0ul,char_const*,char_const*,char_const*,int>
                      ((tuple<const_char_*,_const_char_*,_const_char_*,_int> *)&a);
  ppcVar2 = std::get<1ul,char_const*,char_const*,char_const*,int>
                      ((tuple<const_char_*,_const_char_*,_const_char_*,_int> *)&a);
  ppcVar3 = std::get<2ul,char_const*,char_const*,char_const*,int>
                      ((tuple<const_char_*,_const_char_*,_const_char_*,_int> *)&a);
  p_Var4 = std::get<3ul,char_const*,char_const*,char_const*,int>
                     ((tuple<const_char_*,_const_char_*,_const_char_*,_int> *)&a);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Contents of the tuple:\t");
  poVar5 = std::operator<<(poVar5,*ppcVar1);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,*ppcVar2);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,*ppcVar3);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*p_Var4);
  poVar5 = std::operator<<(poVar5,".");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
	//A tuple with four elements
	std::tuple <const char *, const char *,
		const char *, int> _tuple = std::make_tuple ("Dog", "Cat", "Hyena", 99);

	//C++17
	auto [a,b,c,d] = _tuple;
	std::cout << std::endl;
	std::cout << "Contents of the tuple:\t" << a << ", " << b << ", " << c
				<< ", " << d << "." << std::endl;
	std::cout << std::endl;
}